

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O0

bool __thiscall
FpgaIO::PromWriteBlock25AA128(FpgaIO *this,uint16_t addr,quadlet_t *data,uint nquads,uchar chan)

{
  BasePort *pBVar1;
  uint uVar2;
  int iVar3;
  ostream *this_00;
  nodeaddr_t nVar4;
  PromType local_54;
  quadlet_t write_data;
  nodeaddr_t address;
  PromType prom_type;
  uchar chan_local;
  uint nquads_local;
  quadlet_t *data_local;
  uint16_t addr_local;
  FpgaIO *this_local;
  
  if ((nquads == 0) || (0x10 < nquads)) {
    this_00 = std::operator<<((ostream *)&std::cout,"invalid number of quadlets");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    if (chan == '\x01') {
      local_54 = PROM_25AA128_1;
    }
    else {
      local_54 = PROM_25AA128;
      if (chan == '\x02') {
        local_54 = PROM_25AA128_2;
      }
    }
    nVar4 = GetPromAddress(this,local_54,true);
    pBVar1 = (this->super_BoardIO).port;
    uVar2 = (*pBVar1->_vptr_BasePort[0x27])
                      (pBVar1,(ulong)(this->super_BoardIO).BoardId,nVar4 | 0x100,data,
                       (ulong)(nquads << 2));
    if ((uVar2 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      PromWriteEnable(this,local_54);
      pBVar1 = (this->super_BoardIO).port;
      iVar3 = (*pBVar1->_vptr_BasePort[0x24])
                        (pBVar1,(ulong)(this->super_BoardIO).BoardId,nVar4,
                         (ulong)((uint)addr << 8 | 0xff000000 | nquads - 1));
      this_local._7_1_ = (bool)((byte)iVar3 & 1);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FpgaIO::PromWriteBlock25AA128(uint16_t addr, quadlet_t *data, unsigned int nquads,
                                   unsigned char chan)
{
    // address sanity check
    if (nquads == 0 || nquads > 16) {
        std::cout << "invalid number of quadlets" << std::endl;
        return false;
    }

    PromType prom_type = (chan == 1) ? PROM_25AA128_1 : (chan == 2) ? PROM_25AA128_2 : PROM_25AA128;
    nodeaddr_t address = GetPromAddress(prom_type, true);

    // block write data to buffer
    if (!port->WriteBlock(BoardId, (address|0x0100), data, nquads*sizeof(quadlet_t)))
        return false;

    // enable write
    PromWriteEnable(prom_type);

    // trigger write
    quadlet_t write_data = 0xFF000000|(addr << 8)|(nquads-1);
    return port->WriteQuadlet(BoardId, address, write_data);
}